

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall pg::Game::permute(Game *this,int *mapping)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  
  unsafe_permute(this,mapping);
  this->is_ordered = true;
  lVar3 = 1;
  do {
    if (this->n_vertices <= lVar3) {
      return;
    }
    lVar2 = lVar3 + -1;
    piVar1 = this->_priority + lVar3;
    lVar3 = lVar3 + 1;
  } while (this->_priority[lVar2] <= *piVar1);
  this->is_ordered = false;
  return;
}

Assistant:

void
Game::permute(int *mapping)
{
    unsafe_permute(mapping);

    // check if ordered...
    is_ordered = true;
    for (int i=1; i<n_vertices; i++) {
        if (_priority[i-1] > _priority[i]) {
            is_ordered = false;
            break;
        }
    }
}